

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O3

gnode_t * parse_literal_expression(gravity_parser_t *parser)

{
  int iVar1;
  gravity_lexer_t *lexer;
  gravity_delegate_t *pgVar2;
  long lVar3;
  gnode_r *pgVar4;
  double d;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_s token_02;
  gtoken_s token_03;
  gtoken_s token_04;
  gtoken_s token_05;
  gtoken_s token_06;
  gtoken_s token_07;
  gtoken_s token_08;
  gtoken_s token_09;
  gtoken_s token_10;
  gtoken_s token_11;
  uint32_t uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  byte bVar10;
  gtoken_t token_12;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  gravity_lexer_t **ppgVar14;
  gnode_r *pgVar15;
  gnode_t **ppgVar16;
  gnode_t *pgVar17;
  __int32_t **pp_Var18;
  ulong uVar19;
  gnode_t *pgVar20;
  uint uVar21;
  lexer_r *plVar22;
  ulong uVar23;
  size_t sVar24;
  _Bool allocated;
  ulong uVar25;
  uint32_t uVar26;
  uint uVar27;
  uint uVar28;
  gnode_postfix_expr_t *expr;
  ulong uVar29;
  int iVar30;
  gnode_n tag;
  size_t sVar31;
  undefined8 in_R8;
  undefined8 in_R9;
  uint32_t uVar32;
  gravity_parser_t *pgVar33;
  bool bVar34;
  bool bVar35;
  uint32_t len;
  gtoken_s token;
  char b [3];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  uint32_t local_28c;
  undefined4 local_288;
  uint uStack_284;
  uint uStack_280;
  undefined4 uStack_27c;
  uint32_t local_278;
  undefined4 uStack_274;
  uint32_t uStack_270;
  int iStack_26c;
  char *local_268;
  gravity_parser_t *local_260;
  gnode_r *local_258;
  gravity_lexer_t *local_250;
  char *local_248;
  ulong local_240;
  undefined1 local_238 [2];
  char cStack_236;
  char cStack_235;
  char cStack_234;
  char cStack_233;
  char cStack_232;
  char cStack_231;
  ulong uStack_230;
  char *local_218;
  
  lexer = parser->lexer->p[parser->lexer->n - 1];
  token_12 = gravity_lexer_next(lexer);
  gravity_lexer_token(lexer);
  pcVar11 = local_268;
  iVar30 = iStack_26c;
  uVar32 = uStack_270;
  uVar8 = uStack_274;
  uVar5 = local_278;
  uVar7 = uStack_27c;
  uVar28 = uStack_280;
  uVar27 = uStack_284;
  uVar6 = local_288;
  if (token_12 != TOK_STRING) {
    if (token_12 - TOK_KEY_TRUE < 2) {
      sVar24 = parser->declarations->n;
      if (sVar24 == 0) {
        pgVar20 = (gnode_t *)0x0;
      }
      else {
        pgVar20 = parser->declarations->p[sVar24 - 1];
      }
      token_03.lineno = uStack_284;
      token_03.type = local_288;
      token_03.colno = uStack_280;
      token_03.position = uStack_27c;
      token_03.bytes = local_278;
      token_03.length = uStack_274;
      token_03.fileid = uStack_270;
      token_03.builtin = iStack_26c;
      token_03.value = local_268;
      pgVar20 = gnode_literal_bool_expr_create(token_03,(uint)(token_12 == TOK_KEY_TRUE),pgVar20);
      return pgVar20;
    }
    if (token_12 != TOK_NUMBER) {
      pcVar11 = token_name(token_12);
      token_02.lineno = uStack_284;
      token_02.type = local_288;
      token_02.colno = uStack_280;
      token_02.position = uStack_27c;
      token_02.bytes = local_278;
      token_02.length = uStack_274;
      token_02.fileid = uStack_270;
      token_02.builtin = iStack_26c;
      token_02.value = local_268;
      report_error(parser,GRAVITY_ERROR_SYNTAX,token_02,"Expected literal expression but found %s.",
                   pcVar11,in_R8,in_R9);
      return (gnode_t *)0x0;
    }
    uVar21 = uStack_280;
    if ((iStack_26c == 2) || (uVar21 = uStack_284, iStack_26c == 1)) {
      uVar19 = (ulong)uVar21;
      sVar24 = parser->declarations->n;
      if (sVar24 == 0) {
        pgVar20 = (gnode_t *)0x0;
      }
      else {
        pgVar20 = parser->declarations->p[sVar24 - 1];
      }
      goto LAB_0010dd45;
    }
    if (*local_268 == '0') {
      pp_Var18 = __ctype_toupper_loc();
      iVar1 = (*pp_Var18)[pcVar11[1]];
      if (iVar1 == 0x58) {
        uVar19 = 0;
        memset(local_238,0,0x200);
        local_28c = 0;
        token_10.lineno = uStack_284;
        token_10.type = local_288;
        token_10.colno = uStack_280;
        token_10.position = uStack_27c;
        token_10.bytes = local_278;
        token_10.length = uStack_274;
        token_10.fileid = uStack_270;
        token_10.builtin = iStack_26c;
        token_10.value = local_268;
        pcVar13 = token_string(token_10,&local_28c);
        if (local_28c != 0) {
          uVar21 = 0x200;
          if (local_28c < 0x200) {
            uVar21 = local_28c;
          }
          memcpy(local_238,pcVar13,(ulong)uVar21);
          uVar19 = number_from_hex(local_238,uVar5);
        }
      }
      else if (iVar1 == 0x4f) {
        uVar19 = 0;
        memset(local_238,0,0x200);
        local_28c = 0;
        token_09.lineno = uStack_284;
        token_09.type = local_288;
        token_09.colno = uStack_280;
        token_09.position = uStack_27c;
        token_09.bytes = local_278;
        token_09.length = uStack_274;
        token_09.fileid = uStack_270;
        token_09.builtin = iStack_26c;
        token_09.value = local_268;
        pcVar13 = token_string(token_09,&local_28c);
        uVar26 = local_28c;
        if (local_28c != 0) {
          uVar21 = 0x200;
          if (local_28c < 0x200) {
            uVar21 = local_28c;
          }
          memcpy(local_238,pcVar13,(ulong)uVar21);
          uVar19 = number_from_oct(local_238 + 2,uVar26 - 2);
        }
      }
      else {
        if (iVar1 != 0x42) goto LAB_0010d9e6;
        uVar19 = number_from_bin(pcVar11 + 2,uVar5 - 2);
      }
    }
    else {
LAB_0010d9e6:
      if (uVar5 == 0) {
        bVar35 = false;
      }
      else {
        bVar35 = true;
        uVar19 = 1;
        do {
          if ((pcVar11[uVar19 - 1] == '.') || (pcVar11[uVar19 - 1] == 'e')) break;
          bVar35 = uVar19 < uVar5;
          bVar34 = uVar19 != uVar5;
          uVar19 = uVar19 + 1;
        } while (bVar34);
      }
      memset(local_238,0,0x200);
      local_28c = 0;
      token_07.lineno = uStack_284;
      token_07.type = local_288;
      token_07.colno = uStack_280;
      token_07.position = uStack_27c;
      token_07.bytes = local_278;
      token_07.length = uStack_274;
      token_07.fileid = uStack_270;
      token_07.builtin = iStack_26c;
      token_07.value = local_268;
      pcVar13 = token_string(token_07,&local_28c);
      uVar26 = local_28c;
      if (local_28c != 0) {
        sVar12 = 0x200;
        if (local_28c < 0x200) {
          sVar12 = (size_t)local_28c;
        }
        memcpy(local_238,pcVar13,sVar12);
        if (0x1ff < uVar26) {
          report_error(parser,GRAVITY_ERROR_SYNTAX,0x13fa88);
          return (gnode_t *)0x0;
        }
      }
      if (bVar35) {
        pgVar20 = (gnode_t *)0x0;
        d = strtod(local_238,(char **)0x0);
        sVar24 = parser->declarations->n;
        if (sVar24 != 0) {
          pgVar20 = parser->declarations->p[sVar24 - 1];
        }
        token_08.lineno = uVar27;
        token_08.type = uVar6;
        token_08.colno = uVar28;
        token_08.position = uVar7;
        token_08.bytes = uVar5;
        token_08.length = uVar8;
        token_08.fileid = uVar32;
        token_08.builtin = iVar30;
        token_08.value = pcVar11;
        pgVar20 = gnode_literal_float_expr_create(token_08,d,pgVar20);
        return pgVar20;
      }
      uVar19 = strtoll(local_238,(char **)0x0,0);
    }
    sVar24 = parser->declarations->n;
    if (sVar24 == 0) {
      pgVar20 = (gnode_t *)0x0;
    }
    else {
      pgVar20 = parser->declarations->p[sVar24 - 1];
    }
LAB_0010dd45:
    token_11.lineno = uVar27;
    token_11.type = uVar6;
    token_11.colno = uVar28;
    token_11.position = uVar7;
    token_11.bytes = uVar5;
    token_11.length = uVar8;
    token_11.fileid = uVar32;
    token_11.builtin = iVar30;
    token_11.value = pcVar11;
    pgVar20 = gnode_literal_int_expr_create(token_11,uVar19,pgVar20);
    return pgVar20;
  }
  local_28c = 0;
  token_00.lineno = uStack_284;
  token_00.type = local_288;
  token_00.colno = uStack_280;
  token_00.position = uStack_27c;
  token_00.bytes = local_278;
  token_00.length = uStack_274;
  token_00.fileid = uStack_270;
  token_00.builtin = iStack_26c;
  token_00.value = local_268;
  pcVar11 = token_string(token_00,&local_28c);
  uVar5 = local_28c;
  uVar19 = (ulong)local_28c;
  local_2a8 = CONCAT44(uStack_274,local_278);
  uStack_2a0 = CONCAT44(iStack_26c,uStack_270);
  local_2b8 = CONCAT44(uStack_284,local_288);
  uStack_2b0 = CONCAT44(uStack_27c,uStack_280);
  if (iStack_26c == 5) {
    pgVar33 = (gravity_parser_t *)parser->declarations;
    tag = NODE_CLASS_DECL;
LAB_0010d76d:
    pgVar20 = get_enclosing(pgVar33,tag);
    if (pgVar20 == (gnode_t *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar11 = *(char **)&pgVar20[1].token.colno;
      pcVar13 = "";
      if (pcVar11 != (char *)0x0) {
        pcVar13 = pcVar11;
      }
    }
    sVar12 = strlen(pcVar13);
    uVar32 = (uint32_t)sVar12;
    if (pgVar33->lexer == (lexer_r *)0x0) {
      pgVar20 = (gnode_t *)0x0;
    }
    else {
      pgVar20 = *(gnode_t **)((long)pgVar33->statements + (long)pgVar33->lexer * 8 + -8);
    }
  }
  else {
    if (iStack_26c == 4) {
      pgVar33 = (gravity_parser_t *)parser->declarations;
      tag = NODE_FUNCTION_DECL;
      goto LAB_0010d76d;
    }
    if (((iStack_26c != 3) || (pgVar2 = parser->delegate, pgVar2 == (gravity_delegate_t *)0x0)) ||
       (pgVar2->filename_callback == (gravity_filename_callback)0x0)) {
      local_240 = (ulong)(local_28c + 1);
      uVar32 = 0;
      pcVar13 = (char *)gravity_calloc((gravity_vm *)0x0,1,local_240);
      if (uVar5 != 0) {
        local_258 = (gnode_r *)0x0;
        uVar23 = 0;
        uVar25 = 0;
        local_260 = parser;
        do {
          uVar9 = _local_238;
          uVar28 = (uint)uVar25;
          bVar10 = pcVar11[uVar25];
          uVar32 = (uint32_t)uVar23;
          uVar27 = uVar28;
          if (bVar10 != 0x5c) goto LAB_0010d65f;
          uVar21 = (uint)(uVar25 + 1);
          if (uVar5 <= uVar21) goto LAB_0010d850;
          bVar10 = pcVar11[uVar25 + 1];
          if (bVar10 < 0x62) {
            if (bVar10 < 0x55) {
              uVar27 = uVar21;
              if ((bVar10 == 0x22) || (bVar10 == 0x27)) goto LAB_0010d65f;
              if (bVar10 != 0x28) goto switchD_0010d282_caseD_6f;
              uVar29 = (ulong)(uVar28 + 2);
              iVar30 = 0;
              bVar35 = false;
              uVar25 = uVar29;
              uVar23 = uVar29;
              do {
                uVar26 = uVar5;
                if (uVar19 <= uVar25) break;
                if (pcVar11[uVar25] == '(') {
                  iVar30 = iVar30 + 1;
                }
                else if ((pcVar11[uVar25] == ')') &&
                        (bVar34 = iVar30 == 0, iVar30 = iVar30 + -1, bVar34)) {
                  iVar30 = 0;
                  bVar35 = true;
                }
                uVar25 = uVar25 + 1;
                uVar26 = (int)uVar23 + 1;
                uVar23 = (ulong)uVar26;
              } while (!bVar35);
              if ((!bVar35) || (iVar30 != 0)) {
                pcVar11 = "Malformed interpolation string not closed by )";
                goto LAB_0010d857;
              }
              local_250 = gravity_lexer_create
                                    (pcVar11 + uVar29,(ulong)(uVar26 - (uVar28 + 2)),0,true);
              pgVar33 = local_260;
              plVar22 = local_260->lexer;
              sVar24 = plVar22->n;
              if (sVar24 == plVar22->m) {
                sVar31 = sVar24 * 2;
                if (sVar24 == 0) {
                  sVar31 = 8;
                }
                plVar22->m = sVar31;
                ppgVar14 = (gravity_lexer_t **)realloc(plVar22->p,sVar31 << 3);
                plVar22 = pgVar33->lexer;
                plVar22->p = ppgVar14;
                sVar24 = plVar22->n;
              }
              else {
                ppgVar14 = plVar22->p;
              }
              plVar22->n = sVar24 + 1;
              ppgVar14[sVar24] = local_250;
              pgVar20 = parse_precedence(pgVar33,PREC_LOWEST);
              if (pgVar20 != (gnode_t *)0x0) {
                local_218 = local_268;
                _local_238 = local_2b8;
                uStack_230 = uStack_2b0;
                (pgVar20->token).bytes = local_278;
                (pgVar20->token).length = uStack_274;
                (pgVar20->token).fileid = uStack_270;
                (pgVar20->token).builtin = iStack_26c;
                (pgVar20->token).value = local_268;
                (pgVar20->token).type = local_288;
                (pgVar20->token).lineno = uStack_284;
                (pgVar20->token).colno = uStack_280;
                (pgVar20->token).position = uStack_27c;
                if (pgVar20->tag == NODE_POSTFIX_EXPR) {
                  lVar3 = *(long *)(pgVar20 + 1);
                  if (lVar3 != 0) {
                    *(char **)(lVar3 + 0x30) = local_268;
                    *(undefined8 *)(lVar3 + 0x20) = local_2a8;
                    *(undefined8 *)(lVar3 + 0x28) = uStack_2a0;
                    *(undefined8 *)(lVar3 + 0x10) = local_2b8;
                    *(ulong *)(lVar3 + 0x18) = uStack_2b0;
                  }
                  if ((*(ulong **)&pgVar20[1].block_length != (ulong *)0x0) &&
                     (uVar25 = **(ulong **)&pgVar20[1].block_length, uVar25 != 0)) {
                    uVar23 = 0;
                    do {
                      if ((uVar23 < **(ulong **)&pgVar20[1].block_length) &&
                         (lVar3 = *(long *)((*(ulong **)&pgVar20[1].block_length)[2] + uVar23 * 8),
                         lVar3 != 0)) {
                        *(char **)(lVar3 + 0x30) = local_268;
                        *(undefined8 *)(lVar3 + 0x20) = local_2a8;
                        *(undefined8 *)(lVar3 + 0x28) = uStack_2a0;
                        *(undefined8 *)(lVar3 + 0x10) = local_2b8;
                        *(ulong *)(lVar3 + 0x18) = uStack_2b0;
                      }
                      uVar23 = uVar23 + 1;
                    } while (uVar25 != uVar23);
                  }
                }
                pgVar15 = local_258;
                local_248 = pcVar13;
                if (local_258 == (gnode_r *)0x0) {
                  pgVar15 = gnode_array_create();
                }
                sVar24 = pgVar15->n;
                local_258 = pgVar15;
                if (uVar32 != 0) {
                  if (sVar24 == pgVar15->m) {
                    sVar31 = sVar24 * 2;
                    if (sVar24 == 0) {
                      sVar31 = 8;
                    }
                    pgVar15->m = sVar31;
                    ppgVar16 = (gnode_t **)realloc(pgVar15->p,sVar31 << 3);
                    pgVar15->p = ppgVar16;
                  }
                  sVar24 = local_260->declarations->n;
                  if (sVar24 == 0) {
                    pgVar17 = (gnode_t *)0x0;
                  }
                  else {
                    pgVar17 = local_260->declarations->p[sVar24 - 1];
                  }
                  token_01.colno = uStack_280;
                  token_01.type = local_288;
                  token_01.lineno = uStack_284;
                  token_01.position = uStack_27c;
                  token_01.bytes = local_278;
                  token_01.length = uStack_274;
                  token_01.fileid = uStack_270;
                  token_01.builtin = iStack_26c;
                  token_01.value = local_268;
                  pgVar17 = gnode_literal_string_expr_create(token_01,local_248,uVar32,true,pgVar17)
                  ;
                  sVar31 = local_258->n;
                  sVar24 = sVar31 + 1;
                  local_258->n = sVar24;
                  local_258->p[sVar31] = pgVar17;
                }
                pgVar15 = local_258;
                if (sVar24 == local_258->m) {
                  sVar31 = sVar24 * 2;
                  if (sVar24 == 0) {
                    sVar31 = 8;
                  }
                  local_258->m = sVar31;
                  ppgVar16 = (gnode_t **)realloc(local_258->p,sVar31 << 3);
                  pgVar15->p = ppgVar16;
                  sVar24 = pgVar15->n;
                }
                else {
                  ppgVar16 = local_258->p;
                }
                pgVar15->n = sVar24 + 1;
                ppgVar16[sVar24] = pgVar20;
                pcVar13 = local_248;
              }
              local_260->lexer->n = local_260->lexer->n - 1;
              gravity_lexer_free(local_250);
              if (pgVar20 != (gnode_t *)0x0) {
                uVar23 = 0;
                pcVar13 = (char *)gravity_calloc((gravity_vm *)0x0,1,local_240);
                goto LAB_0010d66b;
              }
              break;
            }
            if (bVar10 == 0x55) {
              if (uVar28 + 9 < uVar5) {
                local_238 = (undefined1  [2])CONCAT11(pcVar11[uVar28 + 3],pcVar11[uVar25 + 2]);
                _local_238 = CONCAT12(pcVar11[uVar28 + 4],local_238);
                _local_238 = CONCAT13(pcVar11[uVar28 + 5],_local_238);
                _local_238 = CONCAT14(pcVar11[uVar28 + 6],_local_238);
                _local_238 = CONCAT17(pcVar11[uVar28 + 9],
                                      CONCAT16(pcVar11[uVar28 + 8],
                                               CONCAT15(pcVar11[uVar28 + 7],_local_238)));
                uStack_230 = uStack_230 & 0xffffffffffffff00;
                uVar25 = strtoul(local_238,(char **)0x0,0x10);
                uVar26 = utf8_encode(pcVar13 + uVar23,(uint32_t)uVar25);
                uVar23 = (ulong)(uVar32 + uVar26);
                uVar26 = uVar28 + 10;
                goto LAB_0010d66b;
              }
              goto LAB_0010d850;
            }
            uVar27 = uVar21;
            if ((bVar10 != 0x5c) &&
               (bVar35 = bVar10 == 0x61, uVar27 = uVar28, bVar10 = 0x5c, bVar35)) {
              bVar10 = 7;
              uVar27 = uVar21;
            }
          }
          else {
            switch(bVar10) {
            case 0x6e:
              bVar10 = 10;
              uVar27 = uVar21;
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
            case 0x77:
switchD_0010d282_caseD_6f:
              bVar10 = 0x5c;
              uVar27 = uVar28;
              break;
            case 0x72:
              bVar10 = 0xd;
              uVar27 = uVar21;
              break;
            case 0x74:
              bVar10 = 9;
              uVar27 = uVar21;
              break;
            case 0x75:
              if (uVar28 + 5 < uVar5) {
                local_238 = (undefined1  [2])CONCAT11(pcVar11[uVar28 + 3],pcVar11[uVar25 + 2]);
                _local_238 = CONCAT12(pcVar11[uVar28 + 4],local_238);
                _local_238 = CONCAT13(pcVar11[uVar28 + 5],_local_238);
                _cStack_233 = SUB83(uVar9,5);
                _local_238 = (uint5)_local_238;
                uVar25 = strtoul(local_238,(char **)0x0,0x10);
                uVar26 = utf8_encode(pcVar13 + uVar23,(uint32_t)uVar25);
                uVar23 = (ulong)(uVar32 + uVar26);
                uVar26 = uVar28 + 6;
                goto LAB_0010d66b;
              }
LAB_0010d850:
              pcVar11 = "Unexpected EOF inside a string literal";
LAB_0010d857:
              report_error(local_260,GRAVITY_ERROR_SYNTAX,pcVar11);
              goto LAB_0010d888;
            case 0x76:
              bVar10 = 0xb;
              uVar27 = uVar21;
              break;
            case 0x78:
              if (uVar5 <= uVar28 + 3) goto LAB_0010d850;
              local_238 = (undefined1  [2])CONCAT11(pcVar11[uVar28 + 3],pcVar11[uVar25 + 2]);
              _local_238 = CONCAT12(0,local_238);
              uVar25 = strtoul(local_238,(char **)0x0,0x10);
              pcVar13[uVar23] = (char)uVar25;
              uVar26 = uVar28 + 4;
              uVar23 = (ulong)(uVar32 + 1);
              goto LAB_0010d66b;
            default:
              if (bVar10 == 0x62) {
                bVar10 = 8;
                uVar27 = uVar21;
              }
              else {
                bVar35 = bVar10 == 0x66;
                bVar10 = 0x5c;
                if (bVar35) {
                  bVar10 = 0xc;
                  uVar27 = uVar21;
                }
              }
            }
          }
LAB_0010d65f:
          pcVar13[uVar23] = bVar10;
          uVar26 = uVar27 + 1;
          uVar23 = (ulong)(uVar32 + 1);
LAB_0010d66b:
          uVar32 = (uint32_t)uVar23;
          uVar25 = (ulong)uVar26;
        } while (uVar26 < uVar5);
LAB_0010d888:
        pgVar15 = local_258;
        pgVar33 = local_260;
        if ((local_258 != (gnode_r *)0x0) && (uVar32 != 0)) {
          sVar24 = local_258->n;
          if (sVar24 == local_258->m) {
            sVar31 = 8;
            if (sVar24 != 0) {
              sVar31 = sVar24 * 2;
            }
            local_258->m = sVar31;
            ppgVar16 = (gnode_t **)realloc(local_258->p,sVar31 << 3);
            pgVar15->p = ppgVar16;
          }
          pgVar4 = pgVar33->declarations;
          sVar24 = pgVar4->n;
          if (sVar24 == 0) {
            pgVar20 = (gnode_t *)0x0;
          }
          else {
            pgVar20 = pgVar4->p[sVar24 - 1];
          }
          token_05.lineno = uStack_284;
          token_05.type = local_288;
          token_05.colno = uStack_280;
          token_05.position = uStack_27c;
          token_05.bytes = local_278;
          token_05.length = uStack_274;
          token_05.fileid = uStack_270;
          token_05.builtin = iStack_26c;
          token_05.value = local_268;
          pgVar20 = gnode_literal_string_expr_create(token_05,pcVar13,uVar32,true,pgVar20);
          sVar24 = pgVar15->n;
          pgVar15->n = sVar24 + 1;
          pgVar15->p[sVar24] = pgVar20;
LAB_0010da7a:
          pgVar4 = pgVar33->declarations;
          sVar24 = pgVar4->n;
          if (sVar24 == 0) {
            pgVar20 = (gnode_t *)0x0;
          }
          else {
            pgVar20 = pgVar4->p[sVar24 - 1];
          }
          token_06.lineno = uStack_284;
          token_06.type = local_288;
          token_06.colno = uStack_280;
          token_06.position = uStack_27c;
          token_06.bytes = local_278;
          token_06.length = uStack_274;
          token_06.fileid = uStack_270;
          token_06.builtin = iStack_26c;
          token_06.value = local_268;
          pgVar20 = gnode_string_interpolation_create(token_06,pgVar15,pgVar20);
          return pgVar20;
        }
        parser = local_260;
        if (local_258 != (gnode_r *)0x0) goto LAB_0010da7a;
      }
      sVar24 = parser->declarations->n;
      if (sVar24 == 0) {
        pgVar20 = (gnode_t *)0x0;
      }
      else {
        pgVar20 = parser->declarations->p[sVar24 - 1];
      }
      allocated = true;
      goto LAB_0010d9b5;
    }
    pcVar11 = (*pgVar2->filename_callback)(uStack_270,pgVar2->xdata);
    pcVar13 = "";
    if (pcVar11 != (char *)0x0) {
      pcVar13 = pcVar11;
    }
    sVar12 = strlen(pcVar13);
    uVar32 = (uint32_t)sVar12;
    sVar24 = parser->declarations->n;
    if (sVar24 == 0) {
      pgVar20 = (gnode_t *)0x0;
    }
    else {
      pgVar20 = parser->declarations->p[sVar24 - 1];
    }
  }
  allocated = false;
LAB_0010d9b5:
  token_04.lineno = uStack_284;
  token_04.type = local_288;
  token_04.colno = uStack_280;
  token_04.position = uStack_27c;
  token_04.bytes = local_278;
  token_04.length = uStack_274;
  token_04.fileid = uStack_270;
  token_04.builtin = iStack_26c;
  token_04.value = local_268;
  pgVar20 = gnode_literal_string_expr_create(token_04,pcVar13,uVar32,allocated,pgVar20);
  return pgVar20;
}

Assistant:

gnode_t *parse_literal_expression (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_literal_expression");
    DECLARE_LEXER;

    gtoken_t type = gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);

    if (type == TOK_STRING) {
        uint32_t len = 0;
        const char *value = token_string(token, &len);
        DEBUG_PARSER("STRING: %.*s", len, value);
        // run string analyzer because string is returned as is from the lexer
        // but string can contains escaping sequences and interpolations that
        // need to be processed
        return parse_analyze_literal_string(parser, token, value, len);
    }

    if (type == TOK_KEY_TRUE || type == TOK_KEY_FALSE) {
        return gnode_literal_bool_expr_create(token, (int32_t)(type == TOK_KEY_TRUE) ? 1 : 0, LAST_DECLARATION());
    }

    if (type != TOK_NUMBER) {
        REPORT_ERROR(token, "Expected literal expression but found %s.", token_name(type));
        return NULL;
    }

    return parse_number_expression(parser, token);
}